

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw.c
# Opt level: O1

uint32_t crc32c_hw(void *input,int len,uint32_t crc)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *buf;
  
  uVar4 = (ulong)~crc;
  if (((ulong)input & 7) != 0 && 0 < len) {
    uVar5 = (long)input + 1;
    uVar3 = len;
    do {
      uVar2 = crc32((int)uVar4,*input);
      uVar4 = (ulong)uVar2;
      len = uVar3 - 1;
      input = (void *)((long)input + 1);
      if ((int)uVar3 < 2) break;
      uVar1 = uVar5 & 7;
      uVar5 = uVar5 + 1;
      uVar3 = len;
    } while (uVar1 != 0);
  }
  for (; 7 < (uint)len; len = len - 8) {
    uVar4 = crc32(uVar4 & 0xffffffff,*input);
    input = (void *)((long)input + 8);
  }
  for (; uVar3 = (uint)uVar4, 3 < (uint)len; len = len - 4) {
    uVar3 = crc32(uVar3,*input);
    uVar4 = (ulong)uVar3;
    input = (void *)((long)input + 4);
  }
  for (; 1 < (uint)len; len = len - 2) {
    uVar3 = crc32((int)uVar4,*input);
    uVar4 = (ulong)uVar3;
    input = (void *)((long)input + 2);
  }
  if (len != 0) {
    uVar3 = crc32(uVar3,*input);
  }
  return ~uVar3;
}

Assistant:

uint32_t crc32c_hw(const void *input, int len, uint32_t crc)
{
    const char* buf = (const char*)input;

    // XOR the initial CRC with INT_MAX
    crc ^= 0xFFFFFFFF;

    // Align the input to the word boundary
    for (; (len > 0) && ((size_t)buf & ALIGN_MASK); len--, buf++) {
        crc = _mm_crc32_u8(crc, *buf);
    }

    // Blast off the CRC32 calculation
#ifdef __x86_64__
    CALC_CRC(_mm_crc32_u64, crc, uint64_t, buf, len);
#endif
    CALC_CRC(_mm_crc32_u32, crc, uint32_t, buf, len);
    CALC_CRC(_mm_crc32_u16, crc, uint16_t, buf, len);
    CALC_CRC(_mm_crc32_u8, crc, uint8_t, buf, len);

    // Post-process the crc
    return (crc ^ 0xFFFFFFFF);
}